

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base.cpp
# Opt level: O3

bool __thiscall
embree::SubdivPatch1Base::updateEdgeLevels
          (SubdivPatch1Base *this,float *edge_level,int *subdiv,SubdivMesh *mesh,int simd_width)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined7 uVar13;
  ulong uVar12;
  uint uVar14;
  int iVar15;
  uint uVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float new_level [4];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  computeEdgeLevels(edge_level,subdiv,&local_28);
  fVar7 = this->level[0];
  fVar8 = this->level[1];
  fVar9 = this->level[2];
  fVar10 = this->level[3];
  this->level[0] = local_28;
  this->level[1] = fStack_24;
  this->level[2] = fStack_20;
  this->level[3] = fStack_1c;
  fVar1 = this->level[2];
  fVar2 = this->level[0];
  fVar17 = fVar1;
  if (fVar1 <= fVar2) {
    fVar17 = fVar2;
  }
  fVar3 = this->level[1];
  fVar4 = this->level[3];
  fVar19 = fVar4;
  if (fVar4 <= fVar3) {
    fVar19 = fVar3;
  }
  this->grid_u_res = (unsigned_short)((int)fVar17 + 1U);
  this->grid_v_res = (unsigned_short)((int)fVar19 + 1U);
  uVar16 = (int)fVar17 + 1U & 0xffff;
  uVar14 = (int)fVar19 + 1U & 0xffff;
  uVar12 = (long)(int)(-simd_width & (simd_width + uVar14 * uVar16) - 1) / (long)simd_width &
           0xffffffff;
  this->grid_size_simd_blocks = (unsigned_short)uVar12;
  bVar5 = this->flags;
  uVar13 = (undefined7)(uVar12 >> 8);
  uVar11 = (undefined4)CONCAT71(uVar13,bVar5);
  this->flags = bVar5 & 0xef;
  if ((((int)fVar2 + 1 < (int)uVar16) || ((int)fVar1 + 1 < (int)uVar16)) ||
     (auVar18._0_4_ = -(uint)((int)fVar4 + 1 < (int)uVar14),
     auVar18._4_4_ = -(uint)((int)fVar4 + 1 < (int)uVar14),
     auVar18._8_4_ = -(uint)((int)fVar3 + 1 < (int)uVar14),
     auVar18._12_4_ = -(uint)((int)fVar3 + 1 < (int)uVar14), iVar15 = movmskpd(uVar14,auVar18),
     iVar15 != 0)) {
    uVar12 = CONCAT71(uVar13,bVar5) | 0x10;
    uVar11 = (undefined4)uVar12;
    this->flags = (uchar)uVar12;
  }
  auVar6._4_4_ = -(uint)((int)fVar8 == (int)fStack_24);
  auVar6._0_4_ = -(uint)((int)fVar7 == (int)local_28);
  auVar6._8_4_ = -(uint)((int)fVar9 == (int)fStack_20);
  auVar6._12_4_ = -(uint)((int)fVar10 == (int)fStack_1c);
  iVar15 = movmskps(uVar11,auVar6);
  return iVar15 != 0xf;
}

Assistant:

bool SubdivPatch1Base::updateEdgeLevels(const float edge_level[4], const int subdiv[4], const SubdivMesh *const mesh, const int simd_width)
  {
    /* calculate edge levels */
    float new_level[4];
    computeEdgeLevels(edge_level,subdiv,new_level);

    /* calculate if tessellation pattern changed */
    bool grid_changed = false;
    for (size_t i=0; i<4; i++) {
      grid_changed |= (int)new_level[i] != (int)level[i]; 
      level[i] = new_level[i];
    }

    /* compute grid resolution */
    Vec2i res = computeGridSize(level);
    grid_u_res = res.x; grid_v_res = res.y;
    grid_size_simd_blocks = ((grid_u_res*grid_v_res+simd_width-1)&(-simd_width)) / simd_width;

    /* need stiching? */
    flags &= ~TRANSITION_PATCH;
    const int int_edge_points0 = (int)level[0] + 1;
    const int int_edge_points1 = (int)level[1] + 1;
    const int int_edge_points2 = (int)level[2] + 1;
    const int int_edge_points3 = (int)level[3] + 1;
    if (int_edge_points0 < (int)grid_u_res ||
	int_edge_points2 < (int)grid_u_res ||
	int_edge_points1 < (int)grid_v_res ||
	int_edge_points3 < (int)grid_v_res) {
      flags |= TRANSITION_PATCH;
    }

    return grid_changed;
  }